

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS TestMarshallArrayNumbers(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  int8_t s8Array [4];
  uint32_t u32sHexArray [4];
  double f64Array [4];
  uint64_t u64Array [4];
  undefined4 local_3d0 [2];
  undefined8 local_3c8;
  uint64_t *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a0;
  uint32_t *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_378;
  int8_t *local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_350;
  double *local_348;
  undefined8 local_340;
  JlMarshallElement marshalStringStruct [8];
  
  memcpy(marshalStringStruct,&DAT_00142070,0x300);
  memset(local_3d0,0,0x98);
  WVar1 = MakeJsonAndVerify(local_3d0,marshalStringStruct,8,
                            "{\"u16sFixed\":[],\"u64sVar\":[],\"u32sHexFixed\":[],\"u32sHexVar\":[],\"s32sFixed\":[],\"s8sVar\":[],\"f32sFixed\":[],\"f64sVar\":[]}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"u16sFixed\\\":[],\\\"u64sVar\\\":[],\" \"\\\"u32sHexFixed\\\":[],\\\"u32sHexVar\\\":[],\" \"\\\"s32sFixed\\\":[],\\\"s8sVar\\\":[],\" \"\\\"f32sFixed\\\":[],\\\"f64sVar\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayNumbers",0x170);
  local_3d0[0] = 0x20001;
  local_3c8 = 2;
  local_3c0 = u64Array;
  u64Array[2] = 0;
  u64Array[3] = 0;
  u64Array[0] = 3;
  u64Array[1] = 4;
  local_3b8 = 2;
  local_3b0 = 0xdef00000abc;
  local_3a0 = 2;
  local_398 = u32sHexArray;
  u32sHexArray[0] = 0x12345;
  u32sHexArray[1] = 0x6789a;
  u32sHexArray[2] = 0;
  u32sHexArray[3] = 0;
  local_390 = 2;
  local_388 = 0x6fffffffb;
  local_378 = 2;
  local_370 = s8Array;
  s8Array[0] = -7;
  s8Array[1] = '\b';
  s8Array[2] = '\0';
  s8Array[3] = '\0';
  local_368 = 2;
  local_360 = 0x4128000041180000;
  local_350 = 2;
  local_348 = f64Array;
  f64Array[2] = 0.0;
  f64Array[3] = 0.0;
  f64Array[0] = 11.5;
  f64Array[1] = 12.5;
  local_340 = 2;
  WVar2 = MakeJsonAndVerify(local_3d0,marshalStringStruct,8,
                            "{\"u16sFixed\":[1,2],\"u64sVar\":[3,4],\"u32sHexFixed\":[2748,3567],\"u32sHexVar\":[74565,424090],\"s32sFixed\":[-5,6],\"s8sVar\":[-7,8],\"f32sFixed\":[9.5,10.5],\"f64sVar\":[11.5,12.5]}"
                           );
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"u16sFixed\\\":[1,2],\\\"u64sVar\\\":[3,4],\" \"\\\"u32sHexFixed\\\":[2748,3567],\\\"u32sHexVar\\\":[74565,424090],\" \"\\\"s32sFixed\\\":[-5,6],\\\"s8sVar\\\":[-7,8],\" \"\\\"f32sFixed\\\":[9.5,10.5],\\\"f64sVar\\\":[11.5,12.5]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayNumbers",0x193);
  WVar3 = MakeJson5AndVerify(local_3d0,marshalStringStruct,8,
                             "{u16sFixed:[1,2],u64sVar:[3,4],u32sHexFixed:[0x0abc,0x0def],u32sHexVar:[0x00012345,0x0006789a],s32sFixed:[-5,6],s8sVar:[-7,8],f32sFixed:[9.5,10.5],f64sVar:[11.5,12.5]}"
                            );
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJson5AndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{u16sFixed:[1,2],u64sVar:[3,4],\" \"u32sHexFixed:[0x0abc,0x0def],u32sHexVar:[0x00012345,0x0006789a],\" \"s32sFixed:[-5,6],s8sVar:[-7,8],\" \"f32sFixed:[9.5,10.5],f64sVar:[11.5,12.5]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayNumbers",0x199);
  WVar4 = WJTL_STATUS_FAILED;
  if ((WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) && WVar3 == WJTL_STATUS_SUCCESS
     ) {
    WVar4 = WJTL_STATUS_SUCCESS;
  }
  return WVar4;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayNumbers
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint16_t u16sFixed[4];
        size_t u16sFixedCount;
        uint64_t* u64sVar;
        size_t u64sVarCount;
        uint32_t u32sHexFixed[4];
        size_t u32sHexFixedCount;
        uint32_t* u32sHexVar;
        size_t u32sHexVarCount;
        int32_t s32sFixed[4];
        size_t s32sFixedCount;
        int8_t* s8sVar;
        size_t s8sVarCount;
        float f32sFixed[4];
        size_t f32sFixedCount;
        double* f64sVar;
        size_t f64sVarCount;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallUnsignedFixedArray( StringStruct, u16sFixed, u16sFixedCount, "u16sFixed" ),
        JlMarshallUnsignedArray( StringStruct, u64sVar, u64sVarCount, "u64sVar" ),
        JlMarshallUnsignedHexFixedArray( StringStruct, u32sHexFixed, u32sHexFixedCount, "u32sHexFixed" ),
        JlMarshallUnsignedHexArray( StringStruct, u32sHexVar, u32sHexVarCount, "u32sHexVar" ),
        JlMarshallSignedFixedArray( StringStruct, s32sFixed, s32sFixedCount, "s32sFixed" ),
        JlMarshallSignedArray( StringStruct, s8sVar, s8sVarCount, "s8sVar" ),
        JlMarshallFloatFixedArray( StringStruct, f32sFixed, f32sFixedCount, "f32sFixed" ),
        JlMarshallFloatArray( StringStruct, f64sVar, f64sVarCount, "f64sVar" ),
    };

    StringStruct theStruct = {{0}};

    // Check marshalling empty arrays
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"u16sFixed\":[],\"u64sVar\":[],"
                                          "\"u32sHexFixed\":[],\"u32sHexVar\":[],"
                                          "\"s32sFixed\":[],\"s8sVar\":[],"
                                          "\"f32sFixed\":[],\"f64sVar\":[]}" ) );

    // Now with numbers
    theStruct.u16sFixed[0] = 1;
    theStruct.u16sFixed[1] = 2;
    theStruct.u16sFixedCount = 2;
    uint64_t u64Array[4] = { 3, 4 };
    theStruct.u64sVar = u64Array;
    theStruct.u64sVarCount = 2;

    theStruct.u32sHexFixed[0] = 0xabc;
    theStruct.u32sHexFixed[1] = 0xdef;
    theStruct.u32sHexFixedCount = 2;
    uint32_t u32sHexArray[4] = { 0x12345, 0x6789a };
    theStruct.u32sHexVar = u32sHexArray;
    theStruct.u32sHexVarCount = 2;

    theStruct.s32sFixed[0] = -5;
    theStruct.s32sFixed[1] = 6;
    theStruct.s32sFixedCount = 2;
    int8_t s8Array[4] = { -7, 8 };
    theStruct.s8sVar = s8Array;
    theStruct.s8sVarCount = 2;

    theStruct.f32sFixed[0] = 9.5;
    theStruct.f32sFixed[1] = 10.5;
    theStruct.f32sFixedCount = 2;
    double f64Array[4] = { 11.5, 12.5 };
    theStruct.f64sVar = f64Array;
    theStruct.f64sVarCount = 2;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"u16sFixed\":[1,2],\"u64sVar\":[3,4],"
                                          "\"u32sHexFixed\":[2748,3567],\"u32sHexVar\":[74565,424090],"
                                          "\"s32sFixed\":[-5,6],\"s8sVar\":[-7,8],"
                                          "\"f32sFixed\":[9.5,10.5],\"f64sVar\":[11.5,12.5]}" ) );

    JL_ASSERT_SUCCESS( MakeJson5AndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{u16sFixed:[1,2],u64sVar:[3,4],"
                                          "u32sHexFixed:[0x0abc,0x0def],u32sHexVar:[0x00012345,0x0006789a],"
                                          "s32sFixed:[-5,6],s8sVar:[-7,8],"
                                          "f32sFixed:[9.5,10.5],f64sVar:[11.5,12.5]}" ) );

    return TestReturn;
}